

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5PasswordAuthenticator::continueAuthenticate
          (QSocks5PasswordAuthenticator *this,QTcpSocket *socket,bool *completed)

{
  char cVar1;
  long lVar2;
  undefined1 *in_RDX;
  long *in_RSI;
  long in_FS_OFFSET;
  QByteArray buf;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  bool local_21;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = 0;
  lVar2 = (**(code **)(*in_RSI + 0xa0))();
  if (lVar2 < 2) {
    local_21 = true;
    goto LAB_0036f4d9;
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QIODevice::read((longlong)&local_20);
  cVar1 = QByteArray::at((QByteArray *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                         ,0x36f481);
  if (cVar1 == '\x01') {
    cVar1 = QByteArray::at((QByteArray *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0x36f498);
    if (cVar1 != '\0') goto LAB_0036f4b7;
    *in_RDX = 1;
    local_21 = true;
  }
  else {
LAB_0036f4b7:
    (**(code **)(*in_RSI + 0x70))();
    local_21 = false;
  }
  QByteArray::~QByteArray((QByteArray *)0x36f4d9);
LAB_0036f4d9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5PasswordAuthenticator::continueAuthenticate(QTcpSocket *socket, bool *completed)
{
    *completed = false;

    if (socket->bytesAvailable() < 2)
        return true;

    QByteArray buf = socket->read(2);
    if (buf.at(0) == S5_PASSWORDAUTH_VERSION && buf.at(1) == 0x00) {
        *completed = true;
        return true;
    }

    // must disconnect
    socket->close();
    return false;
}